

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_sub_string(JSContext *ctx,JSString *p,int start,int end)

{
  ushort uVar1;
  uint uVar2;
  JSValueUnion JVar3;
  long lVar4;
  JSRefCountHeader *p_1;
  uint len;
  ulong uVar5;
  long lVar6;
  JSValue JVar7;
  JSValue JVar8;
  int64_t iStack_20;
  
  uVar2 = (uint)*(undefined8 *)&p->field_0x4;
  if ((uVar2 & 0x7fffffff) == end && start == 0) {
    (p->header).ref_count = (p->header).ref_count + 1;
    iStack_20 = -7;
  }
  else {
    len = end - start;
    lVar6 = (long)start;
    if ((int)len < 1 || -1 < (int)uVar2) {
      JVar7 = js_new_string8(ctx,(uint8_t *)((long)&p[1].header.ref_count + lVar6),len);
    }
    else {
      uVar1 = 0;
      for (lVar4 = lVar6; lVar4 < end; lVar4 = lVar4 + 1) {
        uVar1 = uVar1 | *(ushort *)((long)&p[1].header.ref_count + lVar4 * 2);
      }
      if (uVar1 < 0x100) {
        JVar3.ptr = js_alloc_string(ctx,len,0);
        if ((JSString *)JVar3.ptr == (JSString *)0x0) {
          iStack_20 = 6;
          p = (JSString *)0x0;
          goto LAB_00128c7a;
        }
        for (uVar5 = 0; len != uVar5; uVar5 = uVar5 + 1) {
          *(undefined1 *)((long)JVar3.ptr + uVar5 + 0x10) =
               *(undefined1 *)((long)&p[1].header.ref_count + uVar5 * 2 + lVar6 * 2);
        }
        *(undefined1 *)((long)JVar3.ptr + (ulong)len + 0x10) = 0;
        JVar7.tag = -7;
        JVar7.u.ptr = JVar3.ptr;
      }
      else {
        JVar7 = js_new_string16(ctx,(uint16_t *)((long)&p[1].header.ref_count + lVar6 * 2),len);
      }
    }
    iStack_20 = JVar7.tag;
    p = (JSString *)JVar7.u;
  }
LAB_00128c7a:
  JVar8.tag = iStack_20;
  JVar8.u.ptr = p;
  return JVar8;
}

Assistant:

static JSValue js_sub_string(JSContext *ctx, JSString *p, int start, int end)
{
    int len = end - start;
    if (start == 0 && end == p->len) {
        return JS_DupValue(ctx, JS_MKPTR(JS_TAG_STRING, p));
    }
    if (p->is_wide_char && len > 0) {
        JSString *str;
        int i;
        uint16_t c = 0;
        for (i = start; i < end; i++) {
            c |= p->u.str16[i];
        }
        if (c > 0xFF)
            return js_new_string16(ctx, p->u.str16 + start, len);

        str = js_alloc_string(ctx, len, 0);
        if (!str)
            return JS_EXCEPTION;
        for (i = 0; i < len; i++) {
            str->u.str8[i] = p->u.str16[start + i];
        }
        str->u.str8[len] = '\0';
        return JS_MKPTR(JS_TAG_STRING, str);
    } else {
        return js_new_string8(ctx, p->u.str8 + start, len);
    }
}